

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void test_read_until_zero_length_delim(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  uint8_t buffer [40];
  cio_read_buffer rb;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,"MYHelloWorldExample");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x41e,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  rb.end = (uint8_t *)&rb;
  rb.data = buffer;
  rb.add_ptr = buffer;
  rb.fetch_ptr = buffer;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x425,UNITY_DISPLAY_STYLE_INT);
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x428,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_until
                    (buffered_stream,&rb,"",dummy_read_handler,first_check_buffer);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x42b,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close(buffered_stream);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x42e,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x42f,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x430,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x431,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_val,
             "Handler was not called with original read buffer!",0x432,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_read_until_zero_length_delim(void)
{
#define PRE_DELIM "MY"
#define DELIM "HelloWorld"
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = PRE_DELIM DELIM "Example";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");

	err = cio_buffered_stream_read_until(&client->bs, &rb, "", dummy_read_handler, first_check_buffer);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_val, "Handler was not called with original read buffer!");
}